

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

void __thiscall pstore::stdout_logger::~stdout_logger(stdout_logger *this)

{
  stdout_logger *this_local;
  
  ~stdout_logger(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

stdout_logger::~stdout_logger () noexcept = default;